

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O0

void __thiscall de::BlockBufferCancelTest::Producer::run(Producer *this)

{
  bool bVar1;
  uint __fd;
  CanceledException *anon_var_0;
  undefined1 local_428 [4];
  int blockSize;
  Random rnd;
  deUint8 tmp [1024];
  Producer *this_local;
  
  Random::Random((Random *)local_428,this->m_seed);
  do {
    do {
      __fd = Random::getInt((Random *)local_428,1,0x400);
      BlockBuffer<unsigned_char>::write(this->m_buffer,__fd,&rnd.m_rnd.z,(ulong)__fd);
      bVar1 = Random::getBool((Random *)local_428);
    } while (!bVar1);
    BlockBuffer<unsigned_char>::flush(this->m_buffer);
  } while( true );
}

Assistant:

void run (void)
	{
		deUint8	tmp[1024];
		Random	rnd(m_seed);

		for (;;)
		{
			int blockSize = rnd.getInt(1, DE_LENGTH_OF_ARRAY(tmp));

			try
			{
				m_buffer->write(blockSize, &tmp[0]);

				if (rnd.getBool())
					m_buffer->flush();
			}
			catch (const BlockBuffer<deUint8>::CanceledException&)
			{
				break;
			}
		}
	}